

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_BrepFace::SetMesh(ON_BrepFace *this,mesh_type mt,ON_Mesh *mesh)

{
  recursive_mutex *__mutex;
  bool bVar1;
  Impl *this_00;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  std::recursive_mutex::lock(__mutex);
  if (mt == preview_mesh) {
    this_00 = (Impl *)&this->m_pImpl->m_preview_mesh;
  }
  else if (mt == analysis_mesh) {
    this_00 = (Impl *)&this->m_pImpl->m_analysis_mesh;
  }
  else {
    if (mt != render_mesh) {
      bVar1 = false;
      goto LAB_004114b9;
    }
    this_00 = this->m_pImpl;
  }
  bVar1 = true;
  std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Mesh>
            ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this_00,mesh);
LAB_004114b9:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar1;
}

Assistant:

bool ON_BrepFace::SetMesh(ON::mesh_type mt, ON_Mesh* mesh)
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  bool rc = true;
  switch (mt)
  {
  case ON::render_mesh:
    m_pImpl->m_render_mesh.reset(mesh);
    break;
  case ON::analysis_mesh:
    m_pImpl->m_analysis_mesh.reset(mesh);
    break;
  case ON::preview_mesh:
    m_pImpl->m_preview_mesh.reset(mesh);
    break;
  default:
    rc = false;
  }

  return rc;
}